

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O2

s32 __thiscall irr::gui::CGUITabControl::calculateScrollIndexFromActive(CGUITabControl *this)

{
  int iVar1;
  IGUITab *pIVar2;
  bool bVar3;
  s32 in_EAX;
  s32 sVar4;
  s32 sVar5;
  int iVar6;
  long *plVar7;
  IGUIFont *font;
  wchar_t *pwVar8;
  s32 sVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  s32 pos_rr;
  int local_34;
  
  sVar9 = 0;
  if ((this->ScrollControl == true) &&
     ((this->Tabs).m_data.
      super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->Tabs).m_data.
      super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    pos_rr = in_EAX;
    plVar7 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
    if (plVar7 != (long *)0x0) {
      sVar9 = 0;
      font = (IGUIFont *)(**(code **)(*plVar7 + 0x30))(plVar7,0);
      if (font != (IGUIFont *)0x0) {
        iVar1 = *(int *)&this->field_0x40;
        iVar6 = (this->UpButton->super_IGUIElement).AbsoluteRect.UpperLeftCorner.X;
        _pos_rr = CONCAT44(iVar6 + -2,pos_rr);
        uVar11 = (long)(iVar1 + iVar6) / 2 & 0xffffffff;
        for (uVar12 = (ulong)(uint)this->ActiveTabIndex; sVar5 = (s32)uVar12, 0 < sVar5;
            uVar12 = uVar12 - 1) {
          pIVar2 = (this->Tabs).m_data.
                   super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar12];
          if (pIVar2 != (IGUITab *)0x0) {
            pwVar8 = (wchar_t *)
                     (**(code **)(*(long *)&(pIVar2->super_IGUIElement).super_IEventReceiver + 0xa8)
                     )();
            sVar4 = calcTabWidth(this,font,pwVar8);
            iVar6 = sVar4 / 2;
            if (uVar12 != (uint)this->ActiveTabIndex) {
              iVar6 = sVar4;
            }
            uVar10 = (int)uVar11 - iVar6;
            uVar11 = (ulong)uVar10;
            if ((int)uVar10 < iVar1 + 2) goto LAB_002392d0;
          }
        }
        if (uVar12 != 0) {
LAB_002392d0:
          _pos_rr = _pos_rr & 0xffffffff00000000;
          bVar3 = needScrollControl(this,sVar5,true,&pos_rr);
          if (bVar3) {
LAB_002392ea:
            sVar9 = (s32)uVar12;
          }
          else {
            uVar11 = 1;
            if (sVar5 < 1) {
              uVar11 = uVar12;
            }
            sVar9 = (s32)uVar11;
            iVar1 = local_34;
            for (; 1 < (int)uVar12; uVar12 = uVar12 - 1) {
              pIVar2 = (this->Tabs).m_data.
                       super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar12 - 1];
              if (pIVar2 != (IGUITab *)0x0) {
                pwVar8 = (wchar_t *)
                         (**(code **)(*(long *)&(pIVar2->super_IGUIElement).super_IEventReceiver +
                                     0xa8))();
                sVar5 = calcTabWidth(this,font,pwVar8);
                iVar6 = sVar5 + pos_rr;
                _pos_rr = CONCAT44(local_34,iVar6);
                if (iVar1 < iVar6) goto LAB_002392ea;
              }
            }
          }
        }
      }
    }
  }
  return sVar9;
}

Assistant:

s32 CGUITabControl::calculateScrollIndexFromActive()
{
	if (!ScrollControl || Tabs.empty())
		return 0;

	IGUISkin *skin = Environment->getSkin();
	if (!skin)
		return false;

	IGUIFont *font = skin->getFont();
	if (!font)
		return false;

	const s32 pos_left = AbsoluteRect.UpperLeftCorner.X + 2;
	const s32 pos_right = UpButton->getAbsolutePosition().UpperLeftCorner.X - 2;

	// Move from center to the left border left until it is reached
	s32 pos_cl = (pos_left + pos_right) / 2;
	s32 i = ActiveTabIndex;
	for (; i > 0; --i) {
		if (!Tabs[i])
			continue;

		s32 len = calcTabWidth(font, Tabs[i]->getText());
		if (i == ActiveTabIndex)
			len /= 2;
		if (pos_cl - len < pos_left)
			break;

		pos_cl -= len;
	}
	if (i == 0)
		return i;

	// Is scrolling to right still possible?
	s32 pos_rr = 0;
	if (needScrollControl(i, true, &pos_rr))
		return i; // Yes? -> OK

	// No? -> Decrease "i" more. Append tabs until scrolling becomes necessary
	for (--i; i > 0; --i) {
		if (!Tabs[i])
			continue;

		pos_rr += calcTabWidth(font, Tabs[i]->getText());
		if (pos_rr > pos_right)
			break;
	}
	return i + 1;
}